

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCD.cpp
# Opt level: O0

void __thiscall dg::llvmdg::SCD::computePostDominators(SCD *this,Function *F)

{
  bool bVar1;
  PostDominatorTree *pPVar2;
  PostDominatorTreeWrapperPass *in_RDI;
  pair<std::_Rb_tree_const_iterator<llvm::BasicBlock_*>,_bool> pVar3;
  BasicBlock *pdf;
  iterator __end3;
  iterator __begin3;
  DomSetType *__range3;
  DomSetType *pdfrontiers;
  DomTreeNodeBase<llvm::BasicBlock> *pdtreenode;
  BasicBlock *B;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  PostDominanceFrontiers PDF;
  PostDominatorTreeWrapperPass wrapper;
  PostDominatorTree *pdtree;
  Function *in_stack_fffffffffffffea8;
  reference in_stack_fffffffffffffec8;
  _Rb_tree_const_iterator<llvm::BasicBlock_*> in_stack_fffffffffffffed0;
  _Self local_110;
  _Self local_108;
  DomSetType *local_100;
  DomSetType *local_f8;
  undefined8 local_f0;
  reference local_e8;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  local_e0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  local_d8 [8];
  PostDominatorTreeWrapperPass local_98 [16];
  DomTreeNode *in_stack_ffffffffffffff78;
  PostDominatorTree *in_stack_ffffffffffffff80;
  PostDominanceFrontiers *in_stack_ffffffffffffff88;
  
  llvm::PostDominatorTreeWrapperPass::PostDominatorTreeWrapperPass(local_98);
  llvm::PostDominatorTreeWrapperPass::runOnFunction((Function *)local_98);
  pPVar2 = llvm::PostDominatorTreeWrapperPass::getPostDomTree(local_98);
  PostDominanceFrontiers::PostDominanceFrontiers((PostDominanceFrontiers *)0x26f314);
  local_d8[0].NodePtr = (node_pointer)llvm::Function::begin(in_stack_fffffffffffffea8);
  local_e0.NodePtr = (node_pointer)llvm::Function::end(in_stack_fffffffffffffea8);
  while( true ) {
    bVar1 = llvm::operator!=(local_d8,&local_e0);
    if (!bVar1) break;
    local_e8 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                            *)0x26f373);
    local_f0 = llvm::DominatorTreeBase<llvm::BasicBlock,true>::getNode((BasicBlock *)pPVar2);
    local_100 = PostDominanceFrontiers::calculate
                          (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78);
    local_f8 = local_100;
    local_108._M_node =
         (_Base_ptr)
         std::
         set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
         ::begin((set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
                  *)in_stack_fffffffffffffea8);
    local_110._M_node =
         (_Base_ptr)
         std::
         set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
         ::end((set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
                *)in_stack_fffffffffffffea8);
    while( true ) {
      bVar1 = std::operator!=(&local_108,&local_110);
      if (!bVar1) break;
      std::_Rb_tree_const_iterator<llvm::BasicBlock_*>::operator*
                ((_Rb_tree_const_iterator<llvm::BasicBlock_*> *)0x26f3f8);
      std::
      unordered_map<const_llvm::BasicBlock_*,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
      ::operator[]((unordered_map<const_llvm::BasicBlock_*,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
                    *)in_RDI,(key_type *)in_stack_fffffffffffffea8);
      pVar3 = std::
              set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
              ::insert((set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
                        *)in_stack_fffffffffffffed0._M_node,(value_type *)in_stack_fffffffffffffec8)
      ;
      in_stack_fffffffffffffed0 = pVar3.first._M_node;
      std::
      unordered_map<const_llvm::BasicBlock_*,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
      ::operator[]((unordered_map<const_llvm::BasicBlock_*,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
                    *)in_RDI,(key_type *)in_stack_fffffffffffffea8);
      in_stack_fffffffffffffec8 = local_e8;
      std::
      set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>::
      insert((set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
              *)in_stack_fffffffffffffed0._M_node,(value_type *)local_e8);
      std::_Rb_tree_const_iterator<llvm::BasicBlock_*>::operator++
                ((_Rb_tree_const_iterator<llvm::BasicBlock_*> *)in_RDI);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                  *)in_RDI);
  }
  PostDominanceFrontiers::~PostDominanceFrontiers((PostDominanceFrontiers *)0x26f499);
  llvm::PostDominatorTreeWrapperPass::~PostDominatorTreeWrapperPass(in_RDI);
  return;
}

Assistant:

void SCD::computePostDominators(llvm::Function &F) {
    DBG_SECTION_BEGIN(cda, "Computing post dominators for function "
                                   << F.getName().str());
    using namespace llvm;

    PostDominatorTree *pdtree = nullptr;

    DBG(cda, "Computing post dominator tree");
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 9))

    auto pdtreeptr =
            std::unique_ptr<PostDominatorTree>(new PostDominatorTree());
    pdtree = pdtreeptr.get();
    pdtree->runOnFunction(F); // compute post-dominator tree for this function

#else // LLVM >= 3.9

    PostDominatorTreeWrapperPass wrapper;
    wrapper.runOnFunction(F);
    pdtree = &wrapper.getPostDomTree();

#ifndef NDEBUG
    wrapper.verifyAnalysis();
#endif

    DBG(cda, "Computing post dominator frontiers and adding CD");

#if 0 // this does not work as expected
    llvm::ReverseIDFCalculator PDF(*pdtree);
    for (auto& B : F) {
        llvm::SmallPtrSet<llvm::BasicBlock *, 1> blocks;
        blocks.insert(&B);
        PDF.setDefiningBlocks(blocks);

        SmallVector<BasicBlock *, 8> pdfrontiers;
        PDF.calculate(pdfrontiers);

        // FIXME: reserve the memory
        for (auto *pdf : pdfrontiers) {
            dependencies[&B].insert(pdf);
            dependentBlocks[pdf].insert(&B);
        }
    }
#endif

    PostDominanceFrontiers PDF;

    for (auto &B : F) {
        auto *pdtreenode = pdtree->getNode(&B);
        assert(pdtreenode && "Do not have a node in post-dom tree");
        auto &pdfrontiers = PDF.calculate(*pdtree, pdtreenode);
        for (auto *pdf : pdfrontiers) {
            dependencies[&B].insert(pdf);
            dependentBlocks[pdf].insert(&B);
        }
    }

#endif // LLVM < 3.9

    DBG_SECTION_END(cda, "Done computing post dominators for function "
                                 << F.getName().str());
}